

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::ComputeFeasabilityViolation
          (ChSystemDescriptor *this,double *resulting_maxviolation,double *resulting_feasability)

{
  pointer ppCVar1;
  pointer ppCVar2;
  undefined1 auVar3 [16];
  int iVar4;
  size_t ic;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  
  *resulting_maxviolation = 0.0;
  *resulting_feasability = 0.0;
  ppCVar1 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; auVar6 = in_ZMM0._0_16_, (long)ppCVar1 - (long)ppCVar2 >> 3 != lVar5;
      lVar5 = lVar5 + 1) {
    (*(this->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5]->_vptr_ChConstraint[5])();
    dVar7 = auVar6._0_8_;
    (*(this->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5]->_vptr_ChConstraint[0xc])();
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar6 = vandpd_avx512vl(auVar6,auVar3);
    in_ZMM0 = ZEXT1664(auVar6);
    if (*resulting_maxviolation < auVar6._0_8_) {
      *resulting_maxviolation = auVar6._0_8_;
    }
    iVar4 = (*(this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar5]->_vptr_ChConstraint[3])();
    if ((char)iVar4 != '\0') {
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar7 * (this->vconstraints).
                             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar5]->l_i;
      auVar6 = vandpd_avx512vl(auVar8,auVar6);
      in_ZMM0 = ZEXT1664(auVar6);
      if (*resulting_feasability < auVar6._0_8_) {
        *resulting_feasability = auVar6._0_8_;
      }
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::ComputeFeasabilityViolation(double& resulting_maxviolation, double& resulting_feasability) {
    resulting_maxviolation = 0;
    resulting_feasability = 0;

    auto vc_size = vconstraints.size();

    for (size_t ic = 0; ic < vc_size; ic++) {
        // the the residual of the constraint..
        double mres_i = vconstraints[ic]->Compute_c_i();

        double candidate_violation = fabs(vconstraints[ic]->Violation(mres_i));

        if (candidate_violation > resulting_maxviolation)
            resulting_maxviolation = candidate_violation;

        if (vconstraints[ic]->IsUnilateral()) {
            double candidate_feas = fabs(mres_i * vconstraints[ic]->Get_l_i());  // =|c*l|
            if (candidate_feas > resulting_feasability)
                resulting_feasability = candidate_feas;
        }
    }
}